

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O2

YieldResult * __thiscall
NEST::NESTcalc::GetYieldGamma
          (YieldResult *__return_storage_ptr__,NESTcalc *this,double energy,double density,
          double dfield,double multFact)

{
  double dVar1;
  double dVar2;
  double __y;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  Wvalue WVar6;
  undefined1 local_48 [16];
  undefined8 local_30;
  double local_28;
  undefined8 local_20;
  
  WVar6 = WorkFunction(density,this->fdetector->molarMass,this->fdetector->OldW13eV);
  dVar1 = WVar6.Wq_eV;
  dVar5 = pow(dfield / 165.34,0.72665);
  dVar2 = pow(dfield / 34.195,0.87459);
  auVar3._8_4_ = SUB84(dVar5 + 1.0,0);
  auVar3._0_8_ = dVar2 + 1.0;
  auVar3._12_4_ = (int)((ulong)(dVar5 + 1.0) >> 0x20);
  auVar3 = divpd(_DAT_00113d00,auVar3);
  dVar2 = auVar3._0_8_ + 23.156;
  dVar4 = auVar3._8_8_ + 33.951;
  dVar5 = pow(density,8.2076);
  dVar5 = pow(dfield / (240720.0 / dVar5),0.83344);
  if (this->fdetector->inGas == false) {
    __y = 2.0;
  }
  else {
    __y = -2.0;
  }
  dVar5 = pow(energy / (762.425 / (dVar5 + 1.0) + 66.825),__y);
  dVar5 = (0.0 - dVar2) / (dVar5 + 1.0) +
          (1000.0 / dVar1 - dVar4) / (energy * 0.5 * energy * 0.5 + 1.0) + dVar4 + dVar2;
  if (this->fdetector->OldW13eV == false) {
    dVar5 = dVar5 * 1.08;
  }
  dVar2 = energy * dVar5 * multFact;
  local_48._8_4_ = SUB84(dVar2,0);
  local_48._0_8_ = energy * (((energy * 1000.0) / dVar1) / energy - dVar5 * multFact);
  local_48._12_4_ = (int)((ulong)dVar2 >> 0x20);
  (*this->_vptr_NESTcalc[0x11])(SUB84(energy,0),density,this);
  local_30 = 0x3ff0000000000000;
  local_20 = 0xc08f380000000000;
  local_28 = dfield;
  (*this->_vptr_NESTcalc[0xb])(SUB84(energy,0),dVar1,__return_storage_ptr__,this,local_48);
  return __return_storage_ptr__;
}

Assistant:

YieldResult NESTcalc::GetYieldGamma(double energy, double density,
                                    double dfield, double multFact) {
  Wvalue wvalue = WorkFunction(density, fdetector->get_molarMass(),
                               fdetector->get_OldW13eV());
  double Wq_eV = wvalue.Wq_eV;
  double alpha = wvalue.alpha;
  constexpr double m3 = 2., m4 = 2., m6 = 0.;

  const double m1 =
      33.951 + (3.3284 - 33.951) / (1. + pow(dfield / 165.34, .72665));
  double m2 = 1000 / Wq_eV;
  double m5 = 23.156 + (10.737 - 23.156) / (1. + pow(dfield / 34.195, .87459));
  double densCorr = 240720. / pow(density, 8.2076);
  double m7 =
      66.825 + (829.25 - 66.825) / (1. + pow(dfield / densCorr, .83344));

  double Nq = energy * 1000. / Wq_eV;
  double m8 = 2.;
  if (fdetector->get_inGas()) m8 = -2.;
  double Qy = m1 + (m2 - m1) / (1. + pow(energy / m3, m4)) + m5 +
              (m6 - m5) / (1. + pow(energy / m7, m8));
  if (!fdetector->get_OldW13eV()) Qy *= ZurichEXOQ;
  Qy *= multFact;
  double Ly = Nq / energy - Qy;

  YieldResult result{};
  result.PhotonYield = Ly * energy;
  result.ElectronYield = Qy * energy;
  result.ExcitonRatio = NexONi(energy, density);
  result.Lindhard = 1;
  result.ElectricField = dfield;
  result.DeltaT_Scint = -999;
  return YieldResultValidity(result, energy, Wq_eV);
}